

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_manager.cpp
# Opt level: O3

void __thiscall ot::commissioner::TokenManager::~TokenManager(TokenManager *this)

{
  pointer pcVar1;
  pointer puVar2;
  
  mbedtls_entropy_free((mbedtls_entropy_context *)&this->mEntropy);
  mbedtls_ctr_drbg_free((mbedtls_ctr_drbg_context *)&this->mCtrDrbg);
  mbedtls_pk_free((mbedtls_pk_context_conflict *)&this->mPrivateKey);
  mbedtls_pk_free((mbedtls_pk_context_conflict *)&this->mPublicKey);
  mbedtls_pk_free((mbedtls_pk_context_conflict *)&this->mDomainCAPublicKey);
  coap::CoapSecure::~CoapSecure(&this->mRegistrarClient);
  pcVar1 = (this->mDomainName)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->mDomainName).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->mCommissionerId)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->mCommissionerId).field_2) {
    operator_delete(pcVar1);
  }
  puVar2 = (this->mSignedToken).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
    return;
  }
  return;
}

Assistant:

TokenManager::~TokenManager()
{
    mbedtls_entropy_free(&mEntropy);
    mbedtls_ctr_drbg_free(&mCtrDrbg);
    mbedtls_pk_free(&mPrivateKey);
    mbedtls_pk_free(&mPublicKey);
    mbedtls_pk_free(&mDomainCAPublicKey);
}